

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O2

int main(int argc,char **argv)

{
  size_t __size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  GLFWmonitor *handle;
  GLFWwindow *handle_00;
  GLFWgammaramp *pGVar4;
  unsigned_short *__dest;
  unsigned_short *__dest_00;
  GLFWgammaramp *values;
  float gamma_value;
  int height;
  int width;
  unsigned_short *local_68;
  undefined8 uStack_60;
  GLFWgammaramp orig_ramp;
  nk_font_atlas *atlas;
  
  gamma_value = 1.0;
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    handle = glfwGetPrimaryMonitor();
    handle_00 = glfwCreateWindow(800,400,"Gamma Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle_00 != (GLFWwindow *)0x0) {
      pGVar4 = glfwGetGammaRamp(handle);
      orig_ramp.size = pGVar4->size;
      __size = (ulong)orig_ramp.size * 2;
      __dest = (unsigned_short *)malloc(__size);
      orig_ramp.red = __dest;
      __dest_00 = (unsigned_short *)malloc(__size);
      orig_ramp.green = __dest_00;
      local_68 = (unsigned_short *)malloc(__size);
      values = &orig_ramp;
      orig_ramp.blue = local_68;
      memcpy(__dest,pGVar4->red,__size);
      memcpy(__dest_00,pGVar4->green,__size);
      memcpy(local_68,pGVar4->blue,__size);
      glfwMakeContextCurrent(handle_00);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      nk_glfw3_init(handle_00,NK_GLFW3_INSTALL_CALLBACKS);
      nk_glfw3_font_stash_begin(&atlas);
      nk_glfw3_font_stash_end();
      glfwSetKeyCallback(handle_00,key_callback);
      while( true ) {
        iVar3 = glfwWindowShouldClose(handle_00);
        if (iVar3 != 0) break;
        glfwGetWindowSize(handle_00,&width,&height);
        local_68 = (unsigned_short *)CONCAT44((float)height,(float)width);
        uStack_60 = 0;
        auVar2._4_4_ = (float)height;
        auVar2._0_4_ = (float)width;
        auVar2._8_8_ = 0;
        nk_window_set_bounds(&glfw.ctx,"",(nk_rect)(auVar2 << 0x40));
        (*glad_glClear)(0x4000);
        nk_glfw3_new_frame();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_68;
        iVar3 = nk_begin(&glfw.ctx,"",(nk_rect)(auVar1 << 0x40),0);
        if (iVar3 != 0) {
          nk_layout_row_dynamic(&glfw.ctx,30.0,3);
          iVar3 = nk_slider_float(&glfw.ctx,0.1,&gamma_value,5.0,0.1);
          if (iVar3 != 0) {
            glfwSetGamma(handle,gamma_value);
          }
          nk_labelf(&glfw.ctx,0x11,"%0.1f",(double)gamma_value);
          iVar3 = nk_button_label(&glfw.ctx,"Revert");
          if (iVar3 != 0) {
            glfwSetGammaRamp(handle,&orig_ramp);
          }
          pGVar4 = glfwGetGammaRamp(handle);
          nk_layout_row_dynamic(&glfw.ctx,(float)height + -60.0,3);
          chart_ramp_array((nk_context *)0xff0000ff,(nk_color)pGVar4->size,(int)pGVar4->red,
                           (unsigned_short *)values);
          chart_ramp_array((nk_context *)0xff00ff00,(nk_color)pGVar4->size,(int)pGVar4->green,
                           (unsigned_short *)values);
          chart_ramp_array((nk_context *)0xffff0000,(nk_color)pGVar4->size,(int)pGVar4->blue,
                           (unsigned_short *)values);
        }
        nk_end(&glfw.ctx);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);
        glfwSwapBuffers(handle_00);
        glfwWaitEventsTimeout(1.0);
      }
      free(orig_ramp.red);
      free(orig_ramp.green);
      free(orig_ramp.blue);
      nk_glfw3_shutdown();
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    GLFWgammaramp orig_ramp;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;
    float gamma_value = 1.f;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitor = glfwGetPrimaryMonitor();

    window = glfwCreateWindow(800, 400, "Gamma Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    {
        const GLFWgammaramp* ramp = glfwGetGammaRamp(monitor);
        const size_t array_size = ramp->size * sizeof(short);
        orig_ramp.size = ramp->size;
        orig_ramp.red = malloc(array_size);
        orig_ramp.green = malloc(array_size);
        orig_ramp.blue = malloc(array_size);
        memcpy(orig_ramp.red, ramp->red, array_size);
        memcpy(orig_ramp.green, ramp->green, array_size);
        memcpy(orig_ramp.blue, ramp->blue, array_size);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);
        nk_window_set_bounds(nk, "", area);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            const GLFWgammaramp* ramp;

            nk_layout_row_dynamic(nk, 30, 3);
            if (nk_slider_float(nk, 0.1f, &gamma_value, 5.f, 0.1f))
                glfwSetGamma(monitor, gamma_value);
            nk_labelf(nk, NK_TEXT_LEFT, "%0.1f", gamma_value);
            if (nk_button_label(nk, "Revert"))
                glfwSetGammaRamp(monitor, &orig_ramp);

            ramp = glfwGetGammaRamp(monitor);

            nk_layout_row_dynamic(nk, height - 60.f, 3);
            chart_ramp_array(nk, nk_rgb(255, 0, 0), ramp->size, ramp->red);
            chart_ramp_array(nk, nk_rgb(0, 255, 0), ramp->size, ramp->green);
            chart_ramp_array(nk, nk_rgb(0, 0, 255), ramp->size, ramp->blue);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwWaitEventsTimeout(1.0);
    }

    free(orig_ramp.red);
    free(orig_ramp.green);
    free(orig_ramp.blue);

    nk_glfw3_shutdown();
    glfwTerminate();
    exit(EXIT_SUCCESS);
}